

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node *
lyd_new_path(lyd_node *data_tree,ly_ctx *ctx,char *path,void *value,LYD_ANYDATA_VALUETYPE value_type
            ,int options)

{
  LYS_NODE LVar1;
  int iVar2;
  ly_ctx *plVar3;
  uint uVar4;
  lyd_node *plVar5;
  lys_module *plVar6;
  lys_node *plVar7;
  lyd_node *plVar8;
  lys_node *plVar9;
  long lVar10;
  char *yang_data_name;
  undefined8 uVar11;
  int extraout_EDX;
  lys_module *val_str;
  LY_ECODE ecode;
  lyd_node *plVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  size_t sVar16;
  lys_node *node;
  int iVar17;
  LYS_NODE LVar18;
  char *local_e0;
  char *val_name;
  char *val;
  char *local_c8;
  int local_c0;
  int local_bc;
  int val_name_len;
  int val_len;
  uint local_ac;
  lys_module *local_a8;
  lyd_node *local_a0;
  lyd_node *local_98;
  char *local_90;
  LYS_NODE local_84;
  lys_module *local_80;
  lys_module *local_78;
  char *local_70;
  char *mod_name;
  char *name;
  int has_predicate;
  int local_50;
  int local_4c;
  int parsed;
  int mod_name_len;
  int nam_len;
  int local_34 [2];
  int is_relative;
  
  local_50 = 0;
  local_34[0] = -1;
  if ((path == (char *)0x0) || (data_tree == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0)) {
LAB_00165a7b:
    pcVar15 = "Invalid arguments (%s()).";
    path = "lyd_new_path";
    ctx = (ly_ctx *)0x0;
    goto LAB_00165a95;
  }
  pcVar15 = path;
  local_a0 = data_tree;
  mod_name_len = options;
  if (data_tree == (lyd_node *)0x0) {
    if (*path != '/') goto LAB_00165a7b;
    if (ctx == (ly_ctx *)0x0) goto LAB_00165ab1;
    plVar5 = (lyd_node *)0x0;
    local_80 = (lys_module *)value;
    name._4_4_ = value_type;
    plVar3 = _nam_len;
  }
  else {
    if (ctx == (ly_ctx *)0x0) {
LAB_00165ab1:
      ctx = data_tree->schema->module->ctx;
    }
    pcVar14 = (char *)0x0;
    if (value_type < LYD_ANYDATA_JSON) {
      pcVar14 = (char *)value;
    }
    if (*path == '/') {
      local_80 = (lys_module *)value;
      name._4_4_ = value_type;
      _nam_len = ctx;
      do {
        plVar5 = resolve_partial_json_data_nodeid(path,pcVar14,data_tree,mod_name_len,&local_50);
        iVar17 = mod_name_len;
        if (local_50 != 0) break;
        data_tree = data_tree->next;
      } while (data_tree != (lyd_node *)0x0);
      ctx = _nam_len;
      if (local_50 == 0) {
        plVar6 = (lys_module *)0x0;
        if (name._4_4_ < LYD_ANYDATA_JSON) {
          plVar6 = local_80;
        }
        plVar12 = local_a0->prev;
        plVar8 = plVar12->next;
        while (plVar3 = ctx, plVar8 != (lyd_node *)0x0) {
          _nam_len = ctx;
          plVar5 = resolve_partial_json_data_nodeid(path,(char *)plVar6,plVar12,iVar17,&local_50);
          ctx = _nam_len;
          if (local_50 != 0) goto LAB_00165b2f;
          plVar12 = plVar12->prev;
          plVar8 = plVar12->next;
        }
        goto LAB_00165b77;
      }
    }
    else {
      local_80 = (lys_module *)value;
      name._4_4_ = value_type;
      plVar5 = resolve_partial_json_data_nodeid(path,pcVar14,data_tree,options,&local_50);
    }
LAB_00165b2f:
    if (local_50 == -1) {
      return (lyd_node *)0x0;
    }
    plVar3 = ctx;
    if (local_50 != 0) {
      if (plVar5 == (lyd_node *)0x0) {
        __assert_fail("parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x778,
                      "struct lyd_node *lyd_new_path(struct lyd_node *, const struct ly_ctx *, const char *, void *, LYD_ANYDATA_VALUETYPE, int)"
                     );
      }
      local_34[0] = 1;
      if (path[local_50] == '\0') {
        if ((mod_name_len & 1U) == 0) {
          if (((mod_name_len & 8U) != 0) || (uVar4 = 0, (plVar5->field_0x9 & 1) == 0)) {
            ly_vlog(ctx,LYE_PATH_EXISTS,LY_VLOG_STR,path);
            return (lyd_node *)0x0;
          }
        }
        else {
          uVar4 = mod_name_len & 8;
          if ((uVar4 != 0) && ((plVar5->field_0x9 & 1) != 0)) {
            return (lyd_node *)0x0;
          }
        }
        plVar5 = lyd_new_path_update(plVar5,local_80,name._4_4_,uVar4);
        return plVar5;
      }
      pcVar15 = path + local_50;
      plVar3 = _nam_len;
    }
  }
LAB_00165b77:
  _nam_len = plVar3;
  iVar2 = local_34[0];
  uVar4 = parse_schema_nodeid(pcVar15,&local_70,&local_4c,&mod_name,&parsed,local_34,(int *)0x0,
                              (int *)0x0,1);
  iVar17 = parsed;
  pcVar14 = local_70;
  if ((int)uVar4 < 1) {
LAB_001663b0:
    mod_name = pcVar15 + -uVar4;
    uVar13 = (ulong)(uint)(int)pcVar15[-uVar4];
LAB_001663ca:
    ly_vlog(ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar13,mod_name);
    return (lyd_node *)0x0;
  }
  if (*mod_name == '#') {
    if (local_34[0] != 0) {
      uVar13 = 0x23;
      goto LAB_001663ca;
    }
    local_a8 = (lys_module *)mod_name;
    local_78 = (lys_module *)CONCAT44(local_78._4_4_,local_4c);
    pcVar15 = pcVar15 + uVar4;
    _nam_len = ctx;
    uVar4 = parse_schema_nodeid(pcVar15,&local_70,&local_4c,&mod_name,&parsed,local_34,(int *)&name,
                                (int *)0x0,0);
    ctx = _nam_len;
    if ((int)uVar4 < 1) goto LAB_001663b0;
    yang_data_name = (char *)((long)&local_a8->ctx + 1);
    iVar17 = iVar17 + -1;
    pcVar15 = pcVar15 + uVar4;
    if (pcVar14 != (char *)0x0) {
      local_4c = (int)local_78;
      local_70 = pcVar14;
    }
  }
  else {
    local_34[0] = iVar2;
    uVar4 = parse_schema_nodeid(pcVar15,&local_70,&local_4c,&mod_name,&parsed,local_34,(int *)&name,
                                (int *)0x0,0);
    if ((int)uVar4 < 1) goto LAB_001663b0;
    pcVar15 = pcVar15 + uVar4;
    yang_data_name = (char *)0x0;
    iVar17 = extraout_EDX;
  }
  local_90 = pcVar15;
  if (local_34[0] != 0) {
    if (local_a0 == (lyd_node *)0x0) {
      pcVar15 = "%s: provided relative path (%s) without context node.";
LAB_00165a95:
      ly_log(ctx,LY_LLERR,LY_EINVAL,pcVar15,path);
      return (lyd_node *)0x0;
    }
    if (plVar5 == (lyd_node *)0x0) {
      plVar5 = local_a0;
    }
    plVar9 = plVar5->schema;
    _nam_len = ctx;
    plVar6 = lys_node_module(plVar9);
    goto LAB_00165d66;
  }
  if (plVar5 != (lyd_node *)0x0) {
    __assert_fail("!parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x7bd,
                  "struct lyd_node *lyd_new_path(struct lyd_node *, const struct ly_ctx *, const char *, void *, LYD_ANYDATA_VALUETYPE, int)"
                 );
  }
  if (local_70 == (char *)0x0) {
    pcVar15 = strndup(path,(size_t)(mod_name + ((long)parsed - (long)path)));
    ecode = LYE_PATH_MISSMOD;
  }
  else {
    local_78 = (lys_module *)CONCAT44(local_78._4_4_,iVar17);
    plVar6 = ly_ctx_nget_module(ctx,local_70,(long)local_4c,(char *)0x0,1);
    if (plVar6 != (lys_module *)0x0) {
      local_70 = (char *)0x0;
      local_4c = 0;
      if (yang_data_name == (char *)0x0) {
        plVar5 = (lyd_node *)0x0;
        plVar9 = (lys_node *)0x0;
        _nam_len = ctx;
      }
      else {
        iVar17 = (int)local_78;
        local_a8 = plVar6;
        _nam_len = ctx;
        plVar9 = lyp_get_yang_data_template(plVar6,yang_data_name,(int)local_78);
        if (plVar9 == (lys_node *)0x0) {
          pcVar15 = strndup(path,(size_t)(yang_data_name + ((long)iVar17 - (long)path)));
          ecode = LYE_PATH_INNODE;
          ctx = _nam_len;
          goto LAB_00166450;
        }
        plVar5 = (lyd_node *)0x0;
        plVar6 = local_a8;
      }
LAB_00165d66:
      plVar7 = lys_getnext((lys_node *)0x0,plVar9,plVar6,0);
      plVar12 = (lyd_node *)0x0;
      if (plVar7 != (lys_node *)0x0) {
        local_ac = (uint)mod_name_len >> 3 & 1;
        local_84 = (mod_name_len & 4U) * 0x80 + LYS_INPUT;
        _val_name_len = 0;
        local_a8 = plVar6;
        local_78 = plVar6;
        plVar12 = (lyd_node *)0x0;
        do {
          while (_has_predicate = plVar12, local_98 = plVar5, node = plVar7, pcVar15 = local_70,
                (node->nodetype & 0xc1bd) == LYS_UNKNOWN) {
LAB_00165e3a:
            plVar7 = lys_getnext(node,plVar9,local_a8,0);
            plVar12 = _has_predicate;
            plVar5 = local_98;
            if (plVar7 == (lys_node *)0x0) goto LAB_00166323;
          }
          plVar6 = lys_node_module(node);
          if (pcVar15 == (char *)0x0) {
            if (plVar6 == local_78) goto LAB_00165e18;
            goto LAB_00165e3a;
          }
          pcVar15 = plVar6->name;
          sVar16 = (size_t)local_4c;
          iVar17 = strncmp(pcVar15,local_70,sVar16);
          if ((iVar17 != 0) || (pcVar15[sVar16] != '\0')) goto LAB_00165e3a;
LAB_00165e18:
          pcVar15 = node->name;
          sVar16 = (size_t)parsed;
          iVar17 = strncmp(pcVar15,mod_name,sVar16);
          if ((iVar17 != 0) || (plVar7 = node, pcVar15[sVar16] != '\0')) goto LAB_00165e3a;
          do {
            plVar7 = lys_parent(plVar7);
            LVar18 = local_84;
            pcVar15 = local_90;
            if (plVar7 == (lys_node *)0x0) goto LAB_00165e94;
            LVar1 = plVar7->nodetype;
          } while (LVar1 == LYS_USES);
          if ((mod_name_len & 4U) != 0) {
            if (LVar1 != LYS_INPUT) goto LAB_00165e94;
            goto LAB_00165e3a;
          }
          if (LVar1 == LYS_OUTPUT) goto LAB_00165e3a;
LAB_00165e94:
          LVar1 = node->nodetype;
          if ((int)LVar1 < 0x20) {
            if (7 < (int)LVar1) {
              if (LVar1 != LYS_LEAFLIST) {
                if (LVar1 != LYS_LIST) goto LAB_00166574;
                goto LAB_00165f18;
              }
LAB_00165f48:
              if ((int)name != 0) {
                uVar4 = parse_schema_json_predicate
                                  (local_90,(char **)0x0,(int *)0x0,&local_e0,&local_c0,&val_name,
                                   &local_bc,(int *)&name);
                if ((int)uVar4 < 1) {
                  pcVar14 = pcVar15 + -uVar4;
                  uVar13 = (ulong)(uint)(int)pcVar15[-uVar4];
                }
                else {
                  uVar13 = (ulong)(uint)(int)*local_e0;
                  pcVar14 = local_e0;
                  if (((int)*local_e0 == 0x2e) && (local_c0 == 1)) {
                    plVar6 = (lys_module *)strndup(val_name,(long)local_bc);
                    if (plVar6 == (lys_module *)0x0) {
                      ly_log(_nam_len,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                             "lyd_new_path");
                      goto LAB_00166561;
                    }
                    pcVar15 = pcVar15 + uVar4;
                    goto LAB_00166038;
                  }
                }
LAB_00166525:
                ly_vlog(_nam_len,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar13,pcVar14);
                goto LAB_00166561;
              }
              plVar6 = (lys_module *)0x0;
LAB_00166038:
              if ((int)*pcVar15 == 0) {
                if (((mod_name_len & 0x20U) == 0) || (iVar17 = 1, node->nodetype != LYS_LEAF)) {
                  iVar17 = 0;
                }
                plVar5 = local_98;
                if (local_34[0] == 0) {
                  plVar5 = (lyd_node *)0x0;
                }
                val_str = plVar6;
                if (plVar6 == (lys_module *)0x0) {
                  val_str = local_80;
                }
                local_78 = plVar6;
                plVar5 = _lyd_new_leaf(plVar5,node,(char *)val_str,local_ac,iVar17);
                free(local_78);
                goto LAB_00166097;
              }
              ly_vlog(_nam_len,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)*pcVar15,
                      pcVar15);
LAB_00166510:
              free(plVar6);
LAB_00166561:
              lyd_free_internal_r(_has_predicate,1);
              return (lyd_node *)0x0;
            }
            if (LVar1 == LYS_CONTAINER) goto LAB_00165f18;
            if (LVar1 == LYS_LEAF) goto LAB_00165f48;
LAB_00166574:
            ly_log(_nam_len,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                   ,0x854);
LAB_0016659a:
            pcVar15 = strndup(path,(long)pcVar15 - (long)path);
            if (local_34[0] == 0) {
              ly_vlog(_nam_len,LYE_SPEC,LY_VLOG_STR,pcVar15,"Failed to create node \"%s\".",
                      node->name);
            }
            else {
              ly_vlog(_nam_len,LYE_SPEC,LY_VLOG_STR,pcVar15,
                      "Failed to create node \"%s\" as a child of \"%s\".",node->name,
                      local_98->schema->name);
            }
            plVar12 = _has_predicate;
            free(pcVar15);
            goto LAB_0016635c;
          }
          if ((int)LVar1 < 0x100) {
            if (LVar1 != LYS_ANYXML) {
              if (LVar1 != LYS_NOTIF) goto LAB_00166574;
              goto LAB_00165f18;
            }
LAB_00165fda:
            uVar13 = (ulong)(uint)(int)*local_90;
            pcVar14 = local_90;
            if ((int)*local_90 != 0) goto LAB_00166525;
            if (local_80 == (lys_module *)0x0 && name._4_4_ < LYD_ANYDATA_JSON) {
              name._4_4_ = LYD_ANYDATA_CONSTSTRING;
              local_80 = (lys_module *)0x1a29e4;
            }
            plVar5 = local_98;
            if (local_34[0] == 0) {
              plVar5 = (lyd_node *)0x0;
            }
            plVar5 = lyd_create_anydata(plVar5,node,local_80,name._4_4_);
          }
          else {
            if (LVar1 != LYS_RPC) {
              if (LVar1 == LYS_ANYDATA) goto LAB_00165fda;
              if (LVar1 != LYS_ACTION) goto LAB_00166574;
            }
LAB_00165f18:
            if ((mod_name_len & 2U) != 0) {
              plVar6 = (lys_module *)strndup(path,(size_t)(mod_name + ((long)parsed - (long)path)));
              ly_vlog(_nam_len,LYE_PATH_MISSPAR,LY_VLOG_STR,plVar6);
              goto LAB_00166510;
            }
            plVar5 = local_98;
            if (local_34[0] == 0) {
              plVar5 = (lyd_node *)0x0;
            }
            plVar5 = _lyd_new(plVar5,node,local_ac);
          }
LAB_00166097:
          if (plVar5 == (lyd_node *)0x0) goto LAB_0016659a;
          if (local_34[0] == 0) {
            plVar12 = local_a0;
            if (local_a0 == (lyd_node *)0x0) {
              plVar8 = (lyd_node *)0x0;
            }
            else {
              do {
                plVar8 = plVar12;
                plVar12 = plVar8->next;
              } while (plVar8->next != (lyd_node *)0x0);
              iVar17 = lyd_insert_nextto(plVar8,plVar5,0,1);
              plVar12 = _has_predicate;
              if (iVar17 != 0) goto LAB_0016635c;
            }
            local_a0 = plVar8;
            local_34[0] = 1;
            LVar18 = local_84;
          }
          plVar8 = _has_predicate;
          if ((_val_name_len & 1) == 0) {
            plVar9 = plVar5->schema;
            do {
              plVar9 = lys_parent(plVar9);
              plVar8 = plVar5;
              if (plVar9 == (lys_node *)0x0) goto LAB_0016613e;
            } while (plVar9->nodetype != LVar18);
            iVar17 = lyd_schema_sort(plVar5,0);
            plVar12 = _has_predicate;
            if (iVar17 != 0) goto LAB_0016635c;
          }
LAB_0016613e:
          plVar12 = plVar8;
          local_50 = 0;
          if (node->nodetype == LYS_LIST) {
            lVar10 = 0;
            if ((int)name != 0) {
              iVar17 = lyd_new_path_list_predicate(plVar5,mod_name,pcVar15,&local_50);
              if (iVar17 != 0) goto LAB_0016635c;
              lVar10 = (long)local_50;
            }
          }
          else {
            lVar10 = 0;
          }
          if (pcVar15[lVar10] == '\0') {
            if ((mod_name_len & 0x10U) == 0) {
              return plVar12;
            }
            return plVar5;
          }
          pcVar15 = pcVar15 + lVar10;
          local_78 = lys_node_module(node);
          uVar4 = parse_schema_nodeid(pcVar15,&local_70,&local_4c,&mod_name,&parsed,local_34,
                                      (int *)&name,(int *)0x0,0);
          if ((int)uVar4 < 1) {
            pcVar14 = pcVar15 + -uVar4;
            uVar4 = (uint)pcVar15[-uVar4];
LAB_00166499:
            ly_vlog(_nam_len,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)uVar4,pcVar14);
            goto LAB_0016635c;
          }
          local_90 = pcVar15 + uVar4;
          if (((node->nodetype == LYS_LIST) && (local_70 == (char *)0x0)) &&
             (_val_name_len = (ulong)node->padding[2], _val_name_len != 0)) {
            val = *(char **)&node[1].flags;
            local_c8 = mod_name;
            _has_predicate = (lyd_node *)(long)parsed;
            uVar13 = 0;
            do {
              local_98 = (lyd_node *)**(undefined8 **)(val + uVar13 * 8);
              iVar17 = strncmp((char *)local_98,local_c8,(size_t)_has_predicate);
              if ((iVar17 == 0) &&
                 (*(char *)((long)&_has_predicate->schema + (long)&local_98->schema) == '\0')) {
                uVar4 = (uint)*local_90;
                pcVar14 = local_90;
                if (uVar4 == 0) {
                  return plVar12;
                }
                goto LAB_00166499;
              }
              uVar13 = uVar13 + 1;
            } while (_val_name_len != uVar13);
          }
          uVar11 = 0;
          plVar7 = lys_getnext((lys_node *)0x0,node,local_a8,0);
          _val_name_len = CONCAT71((int7)((ulong)uVar11 >> 8),1);
          plVar9 = node;
        } while (plVar7 != (lys_node *)0x0);
      }
LAB_00166323:
      pcVar15 = strndup(path,(size_t)(mod_name + ((long)parsed - (long)path)));
      ly_vlog(_nam_len,LYE_PATH_INNODE,LY_VLOG_STR,pcVar15);
      free(pcVar15);
LAB_0016635c:
      lyd_free_internal_r(plVar12,1);
      return (lyd_node *)0x0;
    }
    pcVar15 = strndup(path,(size_t)(local_70 + ((long)local_4c - (long)path)));
    ecode = LYE_PATH_INMOD;
  }
LAB_00166450:
  ly_vlog(ctx,ecode,LY_VLOG_STR,pcVar15);
  free(pcVar15);
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_path(struct lyd_node *data_tree, const struct ly_ctx *ctx, const char *path, void *value,
             LYD_ANYDATA_VALUETYPE value_type, int options)
{
    char *str;
    const char *mod_name, *name, *val_name, *val, *node_mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    struct lyd_node *ret = NULL, *node, *parent = NULL;
    const struct lys_node *schild, *sparent, *tmp;
    const struct lys_node_list *slist;
    const struct lys_module *module, *prev_mod;
    int r, i, parsed = 0, mod_name_len, nam_len, val_name_len, val_len;
    int is_relative = -1, has_predicate, first_iter = 1, edit_leaf;
    int backup_is_relative, backup_mod_name_len, yang_data_name_len;

    if (!path || (!data_tree && !ctx)
            || (!data_tree && (path[0] != '/'))) {
        LOGARG;
        return NULL;
    }

    if (!ctx) {
        ctx = data_tree->schema->module->ctx;
    }

    id = path;

    if (data_tree) {
        if (path[0] == '/') {
            /* absolute path, go through all the siblings and try to find the right parent, if exists,
             * first go through all the next siblings keeping the original order, for positional predicates */
            for (node = data_tree; !parsed && node; node = node->next) {
                parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, node,
                                                          options, &parsed);
            }
            if (!parsed) {
                for (node = data_tree->prev; !parsed && node->next; node = node->prev) {
                    parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, node,
                                                              options, &parsed);
                }
            }
        } else {
            /* relative path, use only the provided data tree root */
            parent = resolve_partial_json_data_nodeid(id, value_type > LYD_ANYDATA_STRING ? NULL : value, data_tree,
                                                      options, &parsed);
        }
        if (parsed == -1) {
            return NULL;
        }
        if (parsed) {
            assert(parent);
            /* if we parsed something we have a relative path now for sure, otherwise we don't know */
            is_relative = 1;

            id += parsed;

            if (!id[0]) {
                /* the node exists, are we supposed to update it or is it default? */
                if (!(options & LYD_PATH_OPT_UPDATE) && (!parent->dflt || (options & LYD_PATH_OPT_DFLT))) {
                    LOGVAL(ctx, LYE_PATH_EXISTS, LY_VLOG_STR, path);
                    return NULL;
                }

                /* no change, the default node already exists */
                if (parent->dflt && (options & LYD_PATH_OPT_DFLT)) {
                    return NULL;
                }

                return lyd_new_path_update(parent, value, value_type, options & LYD_PATH_OPT_DFLT);
            }
        }
    }

    backup_is_relative = is_relative;
    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return NULL;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        /* move to the next node in the path */
        id += r;
    } else {
        is_relative = backup_is_relative;
    }

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    /* move to the next node in the path */
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    /* prepare everything for the schema search loop */
    if (is_relative) {
        /* we are relative to data_tree or parent if some part of the path already exists */
        if (!data_tree) {
            LOGERR(ctx, LY_EINVAL, "%s: provided relative path (%s) without context node.", path);
            return NULL;
        } else if (!parent) {
            parent = data_tree;
        }
        sparent = parent->schema;
        module = prev_mod = lys_node_module(sparent);
    } else {
        /* we are starting from scratch, absolute path */
        assert(!parent);
        if (!mod_name) {
            str = strndup(path, (name + nam_len) - path);
            LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        module = ly_ctx_nget_module(ctx, mod_name, mod_name_len, NULL, 1);

        if (!module) {
            str = strndup(path, (mod_name + mod_name_len) - path);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        mod_name = NULL;
        mod_name_len = 0;
        prev_mod = module;

        sparent = NULL;
        if (yang_data_name) {
            sparent = lyp_get_yang_data_template(module, yang_data_name, yang_data_name_len);
            if (!sparent) {
                str = strndup(path, (yang_data_name + yang_data_name_len) - path);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return NULL;
            }
        }
    }

    /* create nodes in a loop */
    while (1) {
        /* find the schema node */
        schild = NULL;
        while ((schild = lys_getnext(schild, sparent, module, 0))) {
            if (schild->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST
                                    | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
                /* module comparison */
                if (mod_name) {
                    node_mod_name = lys_node_module(schild)->name;
                    if (strncmp(node_mod_name, mod_name, mod_name_len) || node_mod_name[mod_name_len]) {
                        continue;
                    }
                } else if (lys_node_module(schild) != prev_mod) {
                    continue;
                }

                /* name check */
                if (strncmp(schild->name, name, nam_len) || schild->name[nam_len]) {
                    continue;
                }

                /* RPC/action in/out check */
                for (tmp = lys_parent(schild); tmp && (tmp->nodetype == LYS_USES); tmp = lys_parent(tmp));
                if (tmp) {
                    if (options & LYD_PATH_OPT_OUTPUT) {
                        if (tmp->nodetype == LYS_INPUT) {
                            continue;
                        }
                    } else {
                        if (tmp->nodetype == LYS_OUTPUT) {
                            continue;
                        }
                    }
                }

                break;
            }
        }

        if (!schild) {
            str = strndup(path, (name + nam_len) - path);
            LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            lyd_free(ret);
            return NULL;
        }

        /* we have the right schema node */
        switch (schild->nodetype) {
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_NOTIF:
        case LYS_RPC:
        case LYS_ACTION:
            if (options & LYD_PATH_OPT_NOPARENT) {
                /* these were supposed to exist */
                str = strndup(path, (name + nam_len) - path);
                LOGVAL(ctx, LYE_PATH_MISSPAR, LY_VLOG_STR, str);
                free(str);
                lyd_free(ret);
                return NULL;
            }
            node = _lyd_new(is_relative ? parent : NULL, schild, (options & LYD_PATH_OPT_DFLT) ? 1 : 0);
            break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
            str = NULL;
            if (has_predicate) {
                if ((r = parse_schema_json_predicate(id, NULL, NULL, &val_name, &val_name_len, &val, &val_len, &has_predicate)) < 1) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                    lyd_free(ret);
                    return NULL;
                }
                id += r;

                if ((val_name[0] != '.') || (val_name_len != 1)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, val_name[0], val_name);
                    lyd_free(ret);
                    return NULL;
                }

                str = strndup(val, val_len);
                if (!str) {
                    LOGMEM(ctx);
                    lyd_free(ret);
                    return NULL;
                }
            }
            if (id[0]) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                free(str);
                lyd_free(ret);
                return NULL;
            }

            if ((options & LYD_PATH_OPT_EDIT) && schild->nodetype == LYS_LEAF) {
                edit_leaf = 1;
            } else {
                edit_leaf = 0;
            }
            node = _lyd_new_leaf(is_relative ? parent : NULL, schild, (str ? str : value),
                                 (options & LYD_PATH_OPT_DFLT) ? 1 : 0, edit_leaf);
            free(str);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (id[0]) {
                LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                lyd_free(ret);
                return NULL;
            }
            if (value_type <= LYD_ANYDATA_STRING && !value) {
                value_type = LYD_ANYDATA_CONSTSTRING;
                value = "";
            }
            node = lyd_create_anydata(is_relative ? parent : NULL, schild, value, value_type);
            break;
        default:
            LOGINT(ctx);
            node = NULL;
            break;
        }

        if (!node) {
            str = strndup(path, id - path);
            if (is_relative) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, str, "Failed to create node \"%s\" as a child of \"%s\".",
                       schild->name, parent->schema->name);
            } else {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, str, "Failed to create node \"%s\".", schild->name);
            }
            free(str);
            lyd_free(ret);
            return NULL;
        }
        /* special case when we are creating a sibling of a top-level data node */
        if (!is_relative) {
            if (data_tree) {
                for (; data_tree->next; data_tree = data_tree->next);
                if (lyd_insert_after(data_tree, node)) {
                    lyd_free(ret);
                    return NULL;
                }
            }
            is_relative = 1;
        }

        if (first_iter) {
            /* sort if needed, but only when inserted somewhere */
            sparent = node->schema;
            do {
                sparent = lys_parent(sparent);
            } while (sparent && (sparent->nodetype != ((options & LYD_PATH_OPT_OUTPUT) ? LYS_OUTPUT : LYS_INPUT)));
            if (sparent && lyd_schema_sort(node, 0)) {
                lyd_free(ret);
                return NULL;
            }

            /* set first created node */
            ret = node;
            first_iter = 0;
        }

        parsed = 0;
        if ((schild->nodetype == LYS_LIST) && has_predicate && lyd_new_path_list_predicate(node, name, id, &parsed)) {
            lyd_free(ret);
            return NULL;
        }
        id += parsed;

        if (!id[0]) {
            /* we are done */
            if (options & LYD_PATH_OPT_NOPARENTRET) {
                /* last created node */
                return node;
            }
            return ret;
        }

        /* prepare for another iteration */
        parent = node;
        sparent = schild;
        prev_mod = lys_node_module(schild);

        /* parse another node */
        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            lyd_free(ret);
            return NULL;
        }
        id += r;

        /* if a key of a list was supposed to be created, it is created as a part of the list instance creation */
        if ((schild->nodetype == LYS_LIST) && !mod_name) {
            slist = (const struct lys_node_list *)schild;
            for (i = 0; i < slist->keys_size; ++i) {
                if (!strncmp(slist->keys[i]->name, name, nam_len) && !slist->keys[i]->name[nam_len]) {
                    /* the path continues? there cannot be anything after a key (leaf) */
                    if (id[0]) {
                        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        lyd_free(ret);
                        return NULL;
                    }
                    return ret;
                }
            }
        }
    }

    LOGINT(ctx);
    return NULL;
}